

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::PLYWriter::addComment(PLYWriter *this,string *s)

{
  undefined8 uVar1;
  void *elem_size;
  long in_RDI;
  PLYElement *comment;
  string *in_stack_ffffffffffffff98;
  PLYElement *in_stack_ffffffffffffffa0;
  allocator *paVar2;
  string *in_stack_ffffffffffffffc8;
  IOException *in_stack_ffffffffffffffd0;
  
  if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    paVar2 = (allocator *)&stack0xffffffffffffffcf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffd0,"Creation of ply header has been completed",paVar2
              );
    gutil::IOException::IOException(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __cxa_throw(uVar1,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  elem_size = operator_new(0x40);
  PLYElement::PLYElement(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(long)elem_size);
  std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::push_back
            ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
             in_stack_ffffffffffffffa0,(value_type *)in_stack_ffffffffffffff98);
  return;
}

Assistant:

void PLYWriter::addComment(const std::string &s)
{
  if (header_complete)
  {
    throw gutil::IOException("Creation of ply header has been completed");
  }

  PLYElement *comment=new PLYElement(s, -1);

  list.push_back(comment);
}